

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,string *arg_lang)

{
  undefined8 *puVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer *ppbVar4;
  undefined1 *puVar5;
  cmake *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer pcVar8;
  key_type *pkVar9;
  key_type *pkVar10;
  pointer pcVar11;
  bool bVar12;
  bool bVar13;
  cmMakefile *this_00;
  undefined8 uVar14;
  Value *pVVar15;
  long *plVar16;
  mapped_type *pmVar17;
  pointer pcVar18;
  string *psVar19;
  iterator iVar20;
  undefined8 *puVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  _func_int **pp_Var23;
  size_type *psVar24;
  _Alloc_hider _Var25;
  pointer pbVar26;
  Value *__range3;
  key_type *pkVar27;
  key_type *__k;
  const_iterator cVar28;
  undefined1 local_6a8 [8];
  size_type local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  string ltmn;
  string target_mods_file;
  cmNinjaDeps ddOutputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_5d0;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> objects;
  Value tm;
  cmNinjaDeps ddOrderOnlyDeps;
  cmNinjaDeps ddExplicitDeps;
  iterator i;
  cmNinjaDeps ddImplicitDeps;
  cmGeneratedFileStream tmf;
  cmGeneratedFileStream ddf;
  Value local_58;
  undefined4 extraout_var;
  
  pcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       (pcVar6->CurrentSnapshot).Position.Position;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(pcVar6->CurrentSnapshot).State;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (pcVar6->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&ddf,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&ddf,dir_cur_bld);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopSource
            ((cmStateDirectory *)&ddf,(dir_top_src->_M_dataplus)._M_p);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopBinary
            ((cmStateDirectory *)&ddf,(dir_top_bld->_M_dataplus)._M_p);
  this_00 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(cmStateSnapshot *)&tmf);
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)this_00;
  uVar14._0_4_ = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator[2])(this,this_00);
  mod_files._M_t._M_impl._0_8_ =
       ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  uVar14._4_4_ = extraout_var;
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  std::vector<cmMakefile*,std::allocator<cmMakefile*>>::emplace_back<cmMakefile*>
            ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (cmMakefile **)&mod_files);
  mod_files._M_t._M_impl._0_8_ = uVar14;
  std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::emplace_back<cmLocalGenerator*>
            ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (cmLocalGenerator **)&mod_files);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&ddf);
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar22 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (arg_ddis->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar7) {
    paVar3 = &target_mods_file.field_2;
    do {
      Json::Value::Value(&tm,nullValue);
      std::ifstream::ifstream(&ddf,(pbVar22->_M_dataplus)._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&tmf);
      bVar12 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false);
      if (bVar12) {
        mod_files._M_t._M_impl._0_8_ =
             &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        vStack_5d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_5d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_5d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pVVar15 = Json::Value::operator[](&tm,"object");
        Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar15);
        std::__cxx11::string::operator=((string *)&mod_files,(string *)&target_mods_file);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_mods_file._M_dataplus._M_p != paVar3) {
          operator_delete(target_mods_file._M_dataplus._M_p,
                          target_mods_file.field_2._M_allocated_capacity + 1);
        }
        pVVar15 = Json::Value::operator[](&tm,"provides");
        bVar13 = Json::Value::isArray(pVVar15);
        if (bVar13) {
          cVar28 = Json::Value::begin(pVVar15);
          ltmn._M_dataplus._M_p = (pointer)cVar28.super_ValueIteratorBase.current_._M_node;
          ltmn._M_string_length =
               CONCAT71(ltmn._M_string_length._1_7_,cVar28.super_ValueIteratorBase.isNull_);
          cVar28 = Json::Value::end(pVVar15);
          local_6a8 = (undefined1  [8])cVar28.super_ValueIteratorBase.current_._M_node;
          local_6a0 = CONCAT71(local_6a0._1_7_,cVar28.super_ValueIteratorBase.isNull_);
          while (bVar13 = Json::ValueIteratorBase::isEqual
                                    ((ValueIteratorBase *)&ltmn,(SelfType *)local_6a8), !bVar13) {
            pVVar15 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
            Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar15);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                       &target_mods_file);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target_mods_file._M_dataplus._M_p != paVar3) {
              operator_delete(target_mods_file._M_dataplus._M_p,
                              target_mods_file.field_2._M_allocated_capacity + 1);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
          }
        }
        pVVar15 = Json::Value::operator[](&tm,"requires");
        bVar13 = Json::Value::isArray(pVVar15);
        if (bVar13) {
          cVar28 = Json::Value::begin(pVVar15);
          ltmn._M_dataplus._M_p = (pointer)cVar28.super_ValueIteratorBase.current_._M_node;
          ltmn._M_string_length =
               CONCAT71(ltmn._M_string_length._1_7_,cVar28.super_ValueIteratorBase.isNull_);
          cVar28 = Json::Value::end(pVVar15);
          local_6a8 = (undefined1  [8])cVar28.super_ValueIteratorBase.current_._M_node;
          local_6a0 = CONCAT71(local_6a0._1_7_,cVar28.super_ValueIteratorBase.isNull_);
          while (bVar13 = Json::ValueIteratorBase::isEqual
                                    ((ValueIteratorBase *)&ltmn,(SelfType *)local_6a8), !bVar13) {
            pVVar15 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
            Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar15);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &vStack_5d0,&target_mods_file);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target_mods_file._M_dataplus._M_p != paVar3) {
              operator_delete(target_mods_file._M_dataplus._M_p,
                              target_mods_file.field_2._M_allocated_capacity + 1);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
          }
        }
        std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::
        emplace_back<cmDyndepObjectInfo>(&objects,(cmDyndepObjectInfo *)&mod_files);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_5d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
        uVar14 = mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        _Var25._M_p = (pointer)mod_files._M_t._M_impl._0_8_;
        if ((_Base_ptr *)mod_files._M_t._M_impl._0_8_ !=
            &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_0030c587:
          operator_delete(_Var25._M_p,(ulong)((long)&((_Base_ptr)uVar14)->_M_color + 1));
        }
      }
      else {
        std::operator+(&target_mods_file,"-E cmake_ninja_dyndep failed to parse ",pbVar22);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&ltmn,(Reader *)&tmf);
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_mods_file._M_dataplus._M_p != paVar3) {
          uVar14 = target_mods_file.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < ltmn._M_string_length + target_mods_file._M_string_length) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
            uVar14 = ltmn.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < ltmn._M_string_length + target_mods_file._M_string_length)
          goto LAB_0030c3ce;
          puVar21 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&ltmn,0,(char *)0x0,(ulong)target_mods_file._M_dataplus._M_p);
        }
        else {
LAB_0030c3ce:
          puVar21 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&target_mods_file,(ulong)ltmn._M_dataplus._M_p);
        }
        mod_files._M_t._M_impl._0_8_ =
             &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        puVar1 = puVar21 + 2;
        if ((undefined8 *)*puVar21 == puVar1) {
          mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar1;
          mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar21[3];
        }
        else {
          mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar1;
          mod_files._M_t._M_impl._0_8_ = (undefined8 *)*puVar21;
        }
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar21[1];
        *puVar21 = puVar1;
        puVar21[1] = 0;
        *(undefined1 *)puVar1 = 0;
        cmSystemTools::Error((string *)&mod_files);
        if ((_Base_ptr *)mod_files._M_t._M_impl._0_8_ !=
            &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)mod_files._M_t._M_impl._0_8_,
                          (ulong)((long)&(mod_files._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
          operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
        }
        uVar14 = target_mods_file.field_2._M_allocated_capacity;
        _Var25._M_p = target_mods_file._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_mods_file._M_dataplus._M_p != paVar3) goto LAB_0030c587;
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._232_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._232_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _248_8_ + 1);
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._160_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _176_8_ + 1);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                 &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x50);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&tmf);
      std::ifstream::~ifstream(&ddf);
      Json::Value::~Value(&tm);
      if (!bVar12) {
        bVar12 = false;
        goto LAB_0030cfdf;
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar7);
  }
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mod_files._M_t._M_impl.super__Rb_tree_header._M_header;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar22 = (linked_target_dirs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (linked_target_dirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pbVar22 != pbVar7) {
    do {
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      pcVar8 = (pbVar22->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tmf,pcVar8,pcVar8 + pbVar22->_M_string_length);
      std::__cxx11::string::append((char *)&tmf);
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&tmf,(ulong)(arg_lang->_M_dataplus)._M_p);
      ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      pp_Var23 = (_func_int **)(plVar16 + 2);
      ppbVar4 = &ddOutputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((_func_int **)*plVar16 == pp_Var23) {
        ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
        ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar16[3];
      }
      else {
        ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
        ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)*plVar16;
      }
      ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar16[1];
      *plVar16 = (long)pp_Var23;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&ddf);
      ltmn._M_dataplus._M_p = (pointer)&ltmn.field_2;
      psVar24 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar24) {
        ltmn.field_2._M_allocated_capacity = *psVar24;
        ltmn.field_2._8_8_ = plVar16[3];
      }
      else {
        ltmn.field_2._M_allocated_capacity = *psVar24;
        ltmn._M_dataplus._M_p = (pointer)*plVar16;
      }
      ltmn._M_string_length = plVar16[1];
      *plVar16 = (long)psVar24;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if (ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      if (tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      Json::Value::Value(&tm,nullValue);
      std::ifstream::ifstream(&ddf,ltmn._M_dataplus._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&tmf);
      if ((((&ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
            [(long)ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream[-3]] & 5) == 0) &&
         (bVar12 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false), !bVar12)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6a8,"-E cmake_ninja_dyndep failed to parse ",pbVar22);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)&ddOutputs,(Reader *)&tmf);
        pbVar2 = (pointer)((long)&((ddOutputs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                          local_6a0);
        pbVar26 = (pointer)0xf;
        if (local_6a8 != (undefined1  [8])&local_698) {
          pbVar26 = (pointer)CONCAT71(local_698._M_allocated_capacity._1_7_,
                                      local_698._M_local_buf[0]);
        }
        if (pbVar26 < pbVar2) {
          pbVar26 = (pointer)0xf;
          if (ddOutputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
            pbVar26 = ddOutputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (pbVar26 < pbVar2) goto LAB_0030d076;
          puVar21 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&ddOutputs,0,(char *)0x0,(ulong)local_6a8);
        }
        else {
LAB_0030d076:
          puVar21 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              (local_6a8,
                               (ulong)ddOutputs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        }
        target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
        psVar24 = puVar21 + 2;
        if ((size_type *)*puVar21 == psVar24) {
          target_mods_file.field_2._M_allocated_capacity = *psVar24;
          target_mods_file.field_2._8_8_ = puVar21[3];
        }
        else {
          target_mods_file.field_2._M_allocated_capacity = *psVar24;
          target_mods_file._M_dataplus._M_p = (pointer)*puVar21;
        }
        target_mods_file._M_string_length = puVar21[1];
        *puVar21 = psVar24;
        puVar21[1] = 0;
        *(char *)psVar24 = '\0';
        cmSystemTools::Error(&target_mods_file);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_mods_file._M_dataplus._M_p != &target_mods_file.field_2) {
          operator_delete(target_mods_file._M_dataplus._M_p,
                          target_mods_file.field_2._M_allocated_capacity + 1);
        }
        if (ddOutputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
          operator_delete(ddOutputs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((ddOutputs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_6a8 != (undefined1  [8])&local_698) {
          operator_delete((void *)local_6a8,
                          CONCAT71(local_698._M_allocated_capacity._1_7_,local_698._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)
            tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._232_8_ !=
            &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
          operator_delete((void *)tmf.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>._232_8_,
                          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _248_8_ + 1);
        }
        if ((undefined1 *)
            tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ !=
            &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0) {
          operator_delete((void *)tmf.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>._160_8_,
                          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _176_8_ + 1);
        }
        std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                  ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                   &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x50
                  );
        std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                  ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&tmf);
        std::ifstream::~ifstream(&ddf);
        Json::Value::~Value(&tm);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
          operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
        }
        bVar12 = false;
        goto LAB_0030cfd2;
      }
      bVar12 = Json::Value::isObject(&tm);
      if (bVar12) {
        Json::Value::begin((Value *)&i);
        while( true ) {
          Json::Value::end((Value *)&target_mods_file);
          bVar12 = Json::ValueIteratorBase::isEqual
                             ((ValueIteratorBase *)&i,(SelfType *)&target_mods_file);
          if (bVar12) break;
          pVVar15 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&i);
          Json::Value::asString_abi_cxx11_((string *)local_6a8,pVVar15);
          Json::ValueIteratorBase::key((Value *)&target_mods_file,(ValueIteratorBase *)&i);
          Json::Value::asString_abi_cxx11_((string *)&ddOutputs,(Value *)&target_mods_file);
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&mod_files,(string *)&ddOutputs);
          std::__cxx11::string::operator=((string *)pmVar17,(string *)local_6a8);
          if (ddOutputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
            operator_delete(ddOutputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((ddOutputs.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          Json::Value::~Value((Value *)&target_mods_file);
          if (local_6a8 != (undefined1  [8])&local_698) {
            operator_delete((void *)local_6a8,
                            CONCAT71(local_698._M_allocated_capacity._1_7_,local_698._M_local_buf[0]
                                    ) + 1);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&i);
        }
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._232_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._232_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _248_8_ + 1);
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._160_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _176_8_ + 1);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                 &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x50);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&tmf);
      std::ifstream::~ifstream(&ddf);
      Json::Value::~Value(&tm);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
        operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar7);
  }
  Json::Value::Value(&tm,objectValue);
  pcVar11 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar18 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pkVar9 = (pcVar18->Provides).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pkVar27 = (pcVar18->Provides).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pkVar27 != pkVar9;
          pkVar27 = pkVar27 + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
                       module_dir,pkVar27);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&mod_files,pkVar27);
        std::__cxx11::string::_M_assign((string *)pmVar17);
        Json::Value::Value(&local_58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf
                          );
        pVVar15 = Json::Value::operator[](&tm,pkVar27);
        Json::Value::operator=(pVVar15,&local_58);
        Json::Value::~Value(&local_58);
        if (ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
      }
      pcVar18 = pcVar18 + 1;
    } while (pcVar18 != pcVar11);
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&ddf,arg_dd,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ddf,"ninja_dyndep_version = 1.0\n",0x1b);
  pcVar11 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar18 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
      target_mods_file._M_string_length = 0;
      target_mods_file.field_2._M_allocated_capacity =
           target_mods_file.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ltmn._M_dataplus._M_p = (pointer)&ltmn.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ltmn,"dyndep","");
      ddOutputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddOutputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ddOutputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      i.super_ValueIteratorBase.current_._M_node = (_Base_ptr)0x0;
      i.super_ValueIteratorBase.isNull_ = false;
      i.super_ValueIteratorBase._9_7_ = 0;
      ddExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ddExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ddImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ddImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ddOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ddOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ &
           0xffffffff00000000;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
           &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
           tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&ddOutputs,&pcVar18->Object);
      pkVar9 = (pcVar18->Provides).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pkVar27 = (pcVar18->Provides).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pkVar27 != pkVar9;
          pkVar27 = pkVar27 + 1) {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&mod_files._M_t,pkVar27);
        psVar19 = ConvertToNinjaPath(this,pmVar17);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i,psVar19);
      }
      pkVar10 = (pcVar18->Requires).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (pcVar18->Requires).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pkVar10; __k = __k + 1) {
        iVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&mod_files._M_t,__k);
        if ((_Rb_tree_header *)iVar20._M_node != &mod_files._M_t._M_impl.super__Rb_tree_header) {
          psVar19 = ConvertToNinjaPath(this,(string *)(iVar20._M_node + 2));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&ddImplicitDeps,psVar19);
        }
      }
      local_6a8 = (undefined1  [8])&local_698;
      if ((pcVar18->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar18->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"restat","");
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&tmf,(key_type *)local_6a8);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar17,0,(char *)pmVar17->_M_string_length,0x584448);
        if (local_6a8 != (undefined1  [8])&local_698) {
          operator_delete((void *)local_6a8,
                          CONCAT71(local_698._M_allocated_capacity._1_7_,local_698._M_local_buf[0])
                          + 1);
        }
      }
      local_6a0 = 0;
      local_698._M_local_buf[0] = '\0';
      local_6a8 = (undefined1  [8])&local_698;
      WriteBuild(this,(ostream *)&ddf,&target_mods_file,&ltmn,&ddOutputs,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i,&ddExplicitDeps,&ddImplicitDeps,&ddOrderOnlyDeps,(cmNinjaVars *)&tmf,
                 (string *)local_6a8,0,(bool *)0x0);
      if (local_6a8 != (undefined1  [8])&local_698) {
        operator_delete((void *)local_6a8,
                        CONCAT71(local_698._M_allocated_capacity._1_7_,local_698._M_local_buf[0]) +
                        1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&tmf);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddOrderOnlyDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddImplicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddExplicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddOutputs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
        operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)target_mods_file._M_dataplus._M_p != &target_mods_file.field_2) {
        operator_delete(target_mods_file._M_dataplus._M_p,
                        target_mods_file.field_2._M_allocated_capacity + 1);
      }
      pcVar18 = pcVar18 + 1;
    } while (pcVar18 != pcVar11);
  }
  cmsys::SystemTools::GetFilenamePath((string *)local_6a8,arg_dd);
  plVar16 = (long *)std::__cxx11::string::append(local_6a8);
  psVar24 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar24) {
    ltmn.field_2._M_allocated_capacity = *psVar24;
    ltmn.field_2._8_8_ = plVar16[3];
    ltmn._M_dataplus._M_p = (pointer)&ltmn.field_2;
  }
  else {
    ltmn.field_2._M_allocated_capacity = *psVar24;
    ltmn._M_dataplus._M_p = (pointer)*plVar16;
  }
  ltmn._M_string_length = plVar16[1];
  *plVar16 = (long)psVar24;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&ltmn,(ulong)(arg_lang->_M_dataplus)._M_p);
  puVar5 = &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  pp_Var23 = (_func_int **)(plVar16 + 2);
  if ((_func_int **)*plVar16 == pp_Var23) {
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar16[3];
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar5;
  }
  else {
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)*plVar16;
  }
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar16[1];
  *plVar16 = (long)pp_Var23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&tmf);
  psVar24 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar24) {
    target_mods_file.field_2._M_allocated_capacity = *psVar24;
    target_mods_file.field_2._8_8_ = plVar16[3];
    target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
  }
  else {
    target_mods_file.field_2._M_allocated_capacity = *psVar24;
    target_mods_file._M_dataplus._M_p = (pointer)*plVar16;
  }
  target_mods_file._M_string_length = plVar16[1];
  *plVar16 = (long)psVar24;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if (tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar5) {
    operator_delete(tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
    operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
  }
  if (local_6a8 != (undefined1  [8])&local_698) {
    operator_delete((void *)local_6a8,
                    CONCAT71(local_698._M_allocated_capacity._1_7_,local_698._M_local_buf[0]) + 1);
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&tmf,&target_mods_file,false,None);
  Json::operator<<((ostream *)&tmf,&tm);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tmf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target_mods_file._M_dataplus._M_p != &target_mods_file.field_2) {
    operator_delete(target_mods_file._M_dataplus._M_p,
                    target_mods_file.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ddf);
  Json::Value::~Value(&tm);
  bVar12 = true;
LAB_0030cfd2:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&mod_files._M_t);
LAB_0030cfdf:
  std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::~vector(&objects);
  return bVar12;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::string const& arg_lang)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    std::unique_ptr<cmLocalNinjaGenerator> lgd(
      static_cast<cmLocalNinjaGenerator*>(
        this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmDyndepObjectInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(arg_ddi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_ddi +
                           reader.getFormattedErrorMessages());
      return false;
    }

    cmDyndepObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (auto const& ddi_provide : ddi_provides) {
        info.Provides.push_back(ddi_provide.asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (auto const& ddi_require : ddi_requires) {
        info.Requires.push_back(ddi_require.asString());
      }
    }
    objects.push_back(std::move(info));
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      linked_target_dir + "/" + arg_lang + "Modules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " +
                           linked_target_dir +
                           reader.getFormattedErrorMessages());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (cmDyndepObjectInfo const& object : objects) {
    for (std::string const& p : object.Provides) {
      std::string const mod = module_dir + p;
      mod_files[p] = mod;
      tm[p] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  for (cmDyndepObjectInfo const& object : objects) {
    std::string const ddComment;
    std::string const ddRule = "dyndep";
    cmNinjaDeps ddOutputs;
    cmNinjaDeps ddImplicitOuts;
    cmNinjaDeps ddExplicitDeps;
    cmNinjaDeps ddImplicitDeps;
    cmNinjaDeps ddOrderOnlyDeps;
    cmNinjaVars ddVars;

    ddOutputs.push_back(object.Object);
    for (std::string const& p : object.Provides) {
      ddImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[p]));
    }
    for (std::string const& r : object.Requires) {
      std::map<std::string, std::string>::iterator m = mod_files.find(r);
      if (m != mod_files.end()) {
        ddImplicitDeps.push_back(this->ConvertToNinjaPath(m->second));
      }
    }
    if (!object.Provides.empty()) {
      ddVars["restat"] = "1";
    }

    this->WriteBuild(ddf, ddComment, ddRule, ddOutputs, ddImplicitOuts,
                     ddExplicitDeps, ddImplicitDeps, ddOrderOnlyDeps, ddVars);
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/" + arg_lang + "Modules.json";
  cmGeneratedFileStream tmf(target_mods_file);
  tmf << tm;

  return true;
}